

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O0

void UConverter_fromUnicode_ISO_2022_KR_OFFSETS_LOGIC
               (UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  char cVar1;
  char cVar2;
  UChar UVar3;
  void *pvVar4;
  UConverterSharedData *sharedData_00;
  undefined8 uVar5;
  bool bVar6;
  uchar uVar7;
  UBool UVar8;
  int iVar9;
  uchar *puVar10;
  int32_t *piVar11;
  int32_t local_70;
  int32_t sourceIndex;
  UChar trail;
  int32_t length;
  UBool useFallback;
  UConverterSharedData *sharedData;
  UConverterDataISO2022 *converterData;
  uint local_48;
  UBool oldIsTargetByteDBCS;
  uint uStack_44;
  UBool isTargetByteDBCS;
  UChar32 sourceChar;
  uint32_t targetByteUnit;
  int32_t *offsets;
  uchar *targetLimit;
  uchar *target;
  UChar *sourceLimit;
  UChar *source;
  UErrorCode *err_local;
  UConverterFromUnicodeArgs *args_local;
  
  sourceLimit = args->source;
  target = (uchar *)args->sourceLimit;
  targetLimit = (uchar *)args->target;
  offsets = (int32_t *)args->targetLimit;
  _sourceChar = args->offsets;
  uStack_44 = 0;
  pvVar4 = args->converter->extraInfo;
  source = (UChar *)err;
  err_local = (UErrorCode *)args;
  if (*(int *)((long)pvVar4 + 0x6c) == 1) {
    UConverter_fromUnicode_ISO_2022_KR_OFFSETS_LOGIC_IBM(args,err);
  }
  else {
    sharedData_00 = *(UConverterSharedData **)(*(long *)((long)pvVar4 + 0x50) + 0x30);
    UVar8 = args->converter->useFallback;
    converterData._7_1_ = (char)args->converter->fromUnicodeStatus;
    local_48 = args->converter->fromUChar32;
    if ((local_48 == 0) || (offsets <= targetLimit)) {
      while (sourceLimit < target) {
        uStack_44 = 0xffff;
        if (*(uchar **)(err_local + 10) <= targetLimit) {
          source[0] = L'\x0f';
          source[1] = L'\0';
          break;
        }
        UVar3 = *sourceLimit;
        local_48 = (uint)(ushort)UVar3;
        if ((local_48 < 0x20) && ((1 << ((byte)UVar3 & 0x1f) & 0x800c000U) != 0)) {
          source[0] = L'\f';
          source[1] = L'\0';
          *(uint *)(*(undefined8 *)(err_local + 2) + 0x54) = local_48;
          sourceLimit = sourceLimit + 1;
          break;
        }
        sourceLimit = sourceLimit + 1;
        sourceIndex = MBCS_FROM_UCHAR32_ISO2022
                                (sharedData_00,local_48,&stack0xffffffffffffffbc,UVar8,1);
        if (sourceIndex < 0) {
          sourceIndex = -sourceIndex;
        }
        if ((((2 < sourceIndex) || (sourceIndex == 0)) || ((sourceIndex == 1 && (0x7f < uStack_44)))
            ) || ((sourceIndex == 2 &&
                  ((0x5d5d < (uStack_44 - 0xa1a1 & 0xffff) || (0x5d < (uStack_44 - 0xa1 & 0xff))))))
           ) {
          uStack_44 = 0xffff;
        }
        if (uStack_44 == 0xffff) {
          if ((local_48 & 0xfffff800) == 0xd800) {
            if ((UVar3 & 0x400U) == 0) goto LAB_00206543;
            source[0] = L'\f';
            source[1] = L'\0';
          }
          else {
            source[0] = L'\n';
            source[1] = L'\0';
          }
          goto LAB_002065c2;
        }
        bVar6 = 0xff < uStack_44;
        if ((bool)converterData._7_1_ != bVar6) {
          if (bVar6) {
            *targetLimit = '\x0e';
          }
          else {
            *targetLimit = '\x0f';
          }
          targetLimit = targetLimit + 1;
          if (_sourceChar != (int *)0x0) {
            *_sourceChar = (int)((long)sourceLimit - *(undefined8 *)(err_local + 4) >> 1) + -1;
            _sourceChar = _sourceChar + 1;
          }
        }
        uVar7 = (uchar)uStack_44;
        converterData._7_1_ = bVar6;
        if (uStack_44 < 0x100) {
          if (targetLimit < offsets) {
            puVar10 = targetLimit + 1;
            *targetLimit = uVar7;
            targetLimit = puVar10;
            if (_sourceChar != (int *)0x0) {
              *_sourceChar = (int)((long)sourceLimit - *(undefined8 *)(err_local + 4) >> 1) + -1;
              _sourceChar = _sourceChar + 1;
            }
          }
          else {
            uVar5 = *(undefined8 *)(err_local + 2);
            cVar1 = *(char *)(*(undefined8 *)(err_local + 2) + 0x5b);
            *(char *)(*(undefined8 *)(err_local + 2) + 0x5b) = cVar1 + '\x01';
            *(uchar *)(uVar5 + ~(U_ERROR_WARNING_START|U_STATE_TOO_OLD_ERROR) + (long)cVar1) = uVar7
            ;
            source[0] = L'\x0f';
            source[1] = L'\0';
          }
        }
        else {
          cVar1 = (char)(uStack_44 >> 8);
          if (targetLimit < offsets) {
            piVar11 = (int32_t *)(targetLimit + 1);
            *targetLimit = cVar1 + 0x80;
            if (_sourceChar != (int *)0x0) {
              *_sourceChar = (int)((long)sourceLimit - *(undefined8 *)(err_local + 4) >> 1) + -1;
              _sourceChar = _sourceChar + 1;
            }
            if (piVar11 < offsets) {
              targetLimit = targetLimit + 2;
              *(uchar *)piVar11 = uVar7 + 0x80;
              if (_sourceChar != (int *)0x0) {
                *_sourceChar = (int)((long)sourceLimit - *(undefined8 *)(err_local + 4) >> 1) + -1;
                _sourceChar = _sourceChar + 1;
              }
            }
            else {
              uVar5 = *(undefined8 *)(err_local + 2);
              cVar1 = *(char *)(*(undefined8 *)(err_local + 2) + 0x5b);
              *(char *)(*(undefined8 *)(err_local + 2) + 0x5b) = cVar1 + '\x01';
              *(uchar *)(uVar5 + ~(U_ERROR_WARNING_START|U_STATE_TOO_OLD_ERROR) + (long)cVar1) =
                   uVar7 + 0x80;
              source[0] = L'\x0f';
              source[1] = L'\0';
              targetLimit = (uchar *)piVar11;
            }
          }
          else {
            uVar5 = *(undefined8 *)(err_local + 2);
            cVar2 = *(char *)(*(undefined8 *)(err_local + 2) + 0x5b);
            *(char *)(*(undefined8 *)(err_local + 2) + 0x5b) = cVar2 + '\x01';
            *(char *)(uVar5 + ~(U_ERROR_WARNING_START|U_STATE_TOO_OLD_ERROR) + (long)cVar2) =
                 cVar1 + -0x80;
            uVar5 = *(undefined8 *)(err_local + 2);
            cVar1 = *(char *)(*(undefined8 *)(err_local + 2) + 0x5b);
            *(char *)(*(undefined8 *)(err_local + 2) + 0x5b) = cVar1 + '\x01';
            *(uchar *)(uVar5 + ~(U_ERROR_WARNING_START|U_STATE_TOO_OLD_ERROR) + (long)cVar1) =
                 uVar7 + 0x80;
            source[0] = L'\x0f';
            source[1] = L'\0';
          }
        }
      }
    }
    else {
LAB_00206543:
      if (sourceLimit < target) {
        UVar3 = *sourceLimit;
        if ((UVar3 & 0xfc00U) == 0xdc00) {
          sourceLimit = sourceLimit + 1;
          local_48 = local_48 * 0x400 + (uint)(ushort)UVar3 + 0xfca02400;
          source[0] = L'\n';
          source[1] = L'\0';
        }
        else {
          source[0] = L'\f';
          source[1] = L'\0';
        }
      }
      else {
        source[0] = L'\0';
        source[1] = L'\0';
      }
LAB_002065c2:
      *(uint *)(*(undefined8 *)(err_local + 2) + 0x54) = local_48;
    }
    UVar8 = U_SUCCESS(*(UErrorCode *)source);
    if ((((UVar8 != '\0') && (converterData._7_1_ != '\0')) && (*(byte *)((long)err_local + 2) != 0)
        ) && ((target <= sourceLimit && (*(int *)(*(undefined8 *)(err_local + 2) + 0x54) == 0)))) {
      converterData._7_1_ = '\0';
      iVar9 = (int)((long)sourceLimit - *(undefined8 *)(err_local + 4) >> 1);
      if (iVar9 < 1) {
        local_70 = -1;
      }
      else {
        local_70 = iVar9 + -1;
        if (((*(ushort *)(*(undefined8 *)(err_local + 4) + (long)local_70 * 2) & 0xfc00) == 0xdc00)
           && ((local_70 == 0 ||
               ((*(ushort *)(*(undefined8 *)(err_local + 4) + (long)(iVar9 + -2) * 2) & 0xfc00) ==
                0xd800)))) {
          local_70 = iVar9 + -2;
        }
      }
      fromUWriteUInt8(*(UConverter **)(err_local + 2),"\x0f",1,&targetLimit,(char *)offsets,
                      (int32_t **)&sourceChar,local_70,(UErrorCode *)source);
    }
    *(UChar **)(err_local + 4) = sourceLimit;
    *(uchar **)(err_local + 8) = targetLimit;
    *(int *)(*(undefined8 *)(err_local + 2) + 0x50) = (int)converterData._7_1_;
  }
  return;
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISO_2022_KR_OFFSETS_LOGIC(UConverterFromUnicodeArgs* args, UErrorCode* err){

    const UChar *source = args->source;
    const UChar *sourceLimit = args->sourceLimit;
    unsigned char *target = (unsigned char *) args->target;
    unsigned char *targetLimit = (unsigned char *) args->targetLimit;
    int32_t* offsets = args->offsets;
    uint32_t targetByteUnit = 0x0000;
    UChar32 sourceChar = 0x0000;
    UBool isTargetByteDBCS;
    UBool oldIsTargetByteDBCS;
    UConverterDataISO2022 *converterData;
    UConverterSharedData* sharedData;
    UBool useFallback;
    int32_t length =0;

    converterData=(UConverterDataISO2022*)args->converter->extraInfo;
    /* if the version is 1 then the user is requesting
     * conversion with ibm-25546 pass the arguments to
     * MBCS converter and return
     */
    if(converterData->version==1){
        UConverter_fromUnicode_ISO_2022_KR_OFFSETS_LOGIC_IBM(args,err);
        return;
    }

    /* initialize data */
    sharedData = converterData->currentConverter->sharedData;
    useFallback = args->converter->useFallback;
    isTargetByteDBCS=(UBool)args->converter->fromUnicodeStatus;
    oldIsTargetByteDBCS = isTargetByteDBCS;

    isTargetByteDBCS   = (UBool) args->converter->fromUnicodeStatus;
    if((sourceChar = args->converter->fromUChar32)!=0 && target <targetLimit) {
        goto getTrail;
    }
    while(source < sourceLimit){

        targetByteUnit = missingCharMarker;

        if(target < (unsigned char*) args->targetLimit){
            sourceChar = *source++;

            /* do not convert SO/SI/ESC */
            if(IS_2022_CONTROL(sourceChar)) {
                /* callback(illegal) */
                *err=U_ILLEGAL_CHAR_FOUND;
                args->converter->fromUChar32=sourceChar;
                break;
            }

            length = MBCS_FROM_UCHAR32_ISO2022(sharedData,sourceChar,&targetByteUnit,useFallback,MBCS_OUTPUT_2);
            if(length < 0) {
                length = -length;  /* fallback */
            }
            /* only DBCS or SBCS characters are expected*/
            /* DB characters with high bit set to 1 are expected */
            if( length > 2 || length==0 ||
                (length == 1 && targetByteUnit > 0x7f) ||
                (length == 2 &&
                    ((uint16_t)(targetByteUnit - 0xa1a1) > (0xfefe - 0xa1a1) ||
                    (uint8_t)(targetByteUnit - 0xa1) > (0xfe - 0xa1)))
            ) {
                targetByteUnit=missingCharMarker;
            }
            if (targetByteUnit != missingCharMarker){

                oldIsTargetByteDBCS = isTargetByteDBCS;
                isTargetByteDBCS = (UBool)(targetByteUnit>0x00FF);
                  /* append the shift sequence */
                if (oldIsTargetByteDBCS != isTargetByteDBCS ){

                    if (isTargetByteDBCS)
                        *target++ = UCNV_SO;
                    else
                        *target++ = UCNV_SI;
                    if(offsets)
                        *(offsets++) = (int32_t)(source - args->source-1);
                }
                /* write the targetUniChar  to target */
                if(targetByteUnit <= 0x00FF){
                    if( target < targetLimit){
                        *(target++) = (unsigned char) targetByteUnit;
                        if(offsets){
                            *(offsets++) = (int32_t)(source - args->source-1);
                        }

                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) (targetByteUnit);
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }else{
                    if(target < targetLimit){
                        *(target++) =(unsigned char) ((targetByteUnit>>8) -0x80);
                        if(offsets){
                            *(offsets++) = (int32_t)(source - args->source-1);
                        }
                        if(target < targetLimit){
                            *(target++) =(unsigned char) (targetByteUnit -0x80);
                            if(offsets){
                                *(offsets++) = (int32_t)(source - args->source-1);
                            }
                        }else{
                            args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) (targetByteUnit -0x80);
                            *err = U_BUFFER_OVERFLOW_ERROR;
                        }
                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) ((targetByteUnit>>8) -0x80);
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (unsigned char) (targetByteUnit-0x80);
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }

            }
            else{
                /* oops.. the code point is unassingned
                 * set the error and reason
                 */

                /*check if the char is a First surrogate*/
                if(U16_IS_SURROGATE(sourceChar)) {
                    if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                        /*look ahead to find the trail surrogate*/
                        if(source <  sourceLimit) {
                            /* test the following code unit */
                            UChar trail=(UChar) *source;
                            if(U16_IS_TRAIL(trail)) {
                                source++;
                                sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                                *err = U_INVALID_CHAR_FOUND;
                                /* convert this surrogate code point */
                                /* exit this condition tree */
                            } else {
                                /* this is an unmatched lead code unit (1st surrogate) */
                                /* callback(illegal) */
                                *err=U_ILLEGAL_CHAR_FOUND;
                            }
                        } else {
                            /* no more input */
                            *err = U_ZERO_ERROR;
                        }
                    } else {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        *err=U_ILLEGAL_CHAR_FOUND;
                    }
                } else {
                    /* callback(unassigned) for a BMP code point */
                    *err = U_INVALID_CHAR_FOUND;
                }

                args->converter->fromUChar32=sourceChar;
                break;
            }
        } /* end if(myTargetIndex<myTargetLength) */
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }

    }/* end while(mySourceIndex<mySourceLength) */

    /*
     * the end of the input stream and detection of truncated input
     * are handled by the framework, but for ISO-2022-KR conversion
     * we need to be in ASCII mode at the very end
     *
     * conditions:
     *   successful
     *   not in ASCII mode
     *   end of input and no truncated input
     */
    if( U_SUCCESS(*err) &&
        isTargetByteDBCS &&
        args->flush && source>=sourceLimit && args->converter->fromUChar32==0
    ) {
        int32_t sourceIndex;

        /* we are switching to ASCII */
        isTargetByteDBCS=FALSE;

        /* get the source index of the last input character */
        /*
         * TODO this would be simpler and more reliable if we used a pair
         * of sourceIndex/prevSourceIndex like in ucnvmbcs.c
         * so that we could simply use the prevSourceIndex here;
         * this code gives an incorrect result for the rare case of an unmatched
         * trail surrogate that is alone in the last buffer of the text stream
         */
        sourceIndex=(int32_t)(source-args->source);
        if(sourceIndex>0) {
            --sourceIndex;
            if( U16_IS_TRAIL(args->source[sourceIndex]) &&
                (sourceIndex==0 || U16_IS_LEAD(args->source[sourceIndex-1]))
            ) {
                --sourceIndex;
            }
        } else {
            sourceIndex=-1;
        }

        fromUWriteUInt8(
            args->converter,
            SHIFT_IN_STR, 1,
            &target, (const char *)targetLimit,
            &offsets, sourceIndex,
            err);
    }

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
    args->converter->fromUnicodeStatus = (uint32_t)isTargetByteDBCS;
}